

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

void __thiscall AllFloatsRoundtripTest::AllFloatsRoundtripTest(AllFloatsRoundtripTest *this)

{
  AllFloatsRoundtripTest *this_local;
  
  ThreadedTest::ThreadedTest(&this->super_ThreadedTest);
  (this->super_ThreadedTest).super_Test._vptr_Test =
       (_func_int **)&PTR__AllFloatsRoundtripTest_0016fbe8;
  return;
}

Assistant:

static LiteralType ClassifyFloat(uint32_t float_bits) {
    if (is_infinity_or_nan(float_bits)) {
      if (float_bits & 0x7fffff) {
        return LiteralType::Nan;
      } else {
        return LiteralType::Infinity;
      }
    } else {
      return LiteralType::Hexfloat;
    }
  }